

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O2

Test * DepfileParserTestMultipleEmptyRules::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x68);
  DepfileParserTestMultipleEmptyRules((DepfileParserTestMultipleEmptyRules *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(DepfileParserTest, MultipleEmptyRules) {
  string err;
  EXPECT_TRUE(Parse("foo: x\n"
                    "foo: \n"
                    "foo:\n", &err));
  ASSERT_EQ(1u, parser_.outs_.size());
  ASSERT_EQ("foo", parser_.outs_[0].AsString());
  ASSERT_EQ(1u, parser_.ins_.size());
  EXPECT_EQ("x", parser_.ins_[0].AsString());
}